

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QHstsPolicyPrivate>::detach_helper(QSharedDataPointer<QHstsPolicyPrivate> *this)

{
  QHstsPolicyPrivate *pQVar1;
  QHstsPolicyPrivate *pQVar2;
  
  pQVar2 = (QHstsPolicyPrivate *)operator_new(0x20);
  pQVar1 = (this->d).ptr;
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  QUrl::QUrl(&pQVar2->url,&pQVar1->url);
  QDateTime::QDateTime(&pQVar2->expiry,&pQVar1->expiry);
  pQVar2->includeSubDomains = pQVar1->includeSubDomains;
  LOCK();
  (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QHstsPolicyPrivate *)0x0) {
      QDateTime::~QDateTime(&pQVar1->expiry);
      QUrl::~QUrl(&pQVar1->url);
    }
    operator_delete(pQVar1,0x20);
  }
  (this->d).ptr = pQVar2;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}